

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

RefCntAutoPtr<Diligent::IRenderDevice> * __thiscall
Diligent::RefCntAutoPtr<Diligent::IRenderDevice>::operator=
          (RefCntAutoPtr<Diligent::IRenderDevice> *this,IRenderDevice *pObj)

{
  IRenderDevice *pIVar1;
  
  pIVar1 = this->m_pObject;
  if (pIVar1 != pObj) {
    if (pIVar1 != (IRenderDevice *)0x0) {
      (*(pIVar1->super_IObject)._vptr_IObject[2])();
    }
    this->m_pObject = pObj;
    if (pObj != (IRenderDevice *)0x0) {
      (*(pObj->super_IObject)._vptr_IObject[1])(pObj);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }